

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_GL.c
# Opt level: O2

void resize_GL(SWindowData *window_data)

{
  if (window_data->is_initialized == true) {
    glViewport(0,0,window_data->window_width,window_data->window_height);
    glMatrixMode(0x1701);
    glLoadIdentity();
    glOrtho(0,(double)window_data->window_width,(double)window_data->window_height,0,
            0x40a0000000000000,0xc0a0000000000000);
    glClear(0x4000);
    return;
  }
  return;
}

Assistant:

void 
resize_GL(SWindowData *window_data) {
    if(window_data->is_initialized) {
        glViewport(0, 0, window_data->window_width, window_data->window_height);

        glMatrixMode(GL_PROJECTION);
        glLoadIdentity();
        glOrtho(0, window_data->window_width, window_data->window_height, 0, 2048, -2048);

        glClear(GL_COLOR_BUFFER_BIT);
    }
}